

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O0

void __thiscall
DataSourceDOS::SpriteDosSolid::SpriteDosSolid(SpriteDosSolid *this,PBuffer *_data,ColorDOS *palette)

{
  ColorDOS *pCVar1;
  uchar value;
  undefined1 value_00;
  undefined1 value_01;
  bool bVar2;
  byte bVar3;
  element_type *peVar4;
  ExceptionFreeserf *this_00;
  element_type *peVar5;
  uint8_t *puVar6;
  uchar local_88;
  uchar uStack_87;
  ColorDOS color;
  PMutableBuffer result;
  string local_68;
  size_t local_48;
  size_t size;
  shared_ptr<Buffer> local_30;
  ColorDOS *local_20;
  ColorDOS *palette_local;
  PBuffer *_data_local;
  SpriteDosSolid *this_local;
  
  local_20 = palette;
  palette_local = (ColorDOS *)_data;
  _data_local = (PBuffer *)this;
  std::shared_ptr<Buffer>::shared_ptr(&local_30,_data);
  SpriteBaseDOS::SpriteBaseDOS(&this->super_SpriteBaseDOS,&local_30);
  std::shared_ptr<Buffer>::~shared_ptr(&local_30);
  (this->super_SpriteBaseDOS).super_SpriteBase.super_Sprite._vptr_Sprite =
       (_func_int **)&PTR_get_data_001a4d58;
  peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)_data
                     );
  local_48 = Buffer::get_size(peVar4);
  if (local_48 !=
      (this->super_SpriteBaseDOS).super_SpriteBase.width *
      (this->super_SpriteBaseDOS).super_SpriteBase.height + 10) {
    result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1
    ;
    this_00 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Failed to extract DOS solid sprite",
               (allocator<char> *)
               ((long)&result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    ExceptionFreeserf::ExceptionFreeserf(this_00,&local_68);
    result.super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0
    ;
    __cxa_throw(this_00,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
  }
  std::make_shared<MutableBuffer,Buffer::EndianessMode>((EndianessMode *)&color);
  while( true ) {
    peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        _data);
    bVar2 = Buffer::readable(peVar4);
    pCVar1 = local_20;
    if (!bVar2) break;
    peVar4 = std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        _data);
    bVar3 = Buffer::pop<unsigned_char>(peVar4);
    value = pCVar1[bVar3].b;
    pCVar1 = pCVar1 + bVar3;
    value_00 = pCVar1->r;
    value_01 = pCVar1->g;
    peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&color);
    MutableBuffer::push<unsigned_char>(peVar5,value,1);
    peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&color);
    MutableBuffer::push<unsigned_char>(peVar5,value_01,1);
    peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&color);
    MutableBuffer::push<unsigned_char>(peVar5,value_00,1);
    peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&color);
    MutableBuffer::push<unsigned_char>(peVar5,0xff,1);
  }
  peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&color);
  puVar6 = (uint8_t *)MutableBuffer::unfix(peVar5);
  (this->super_SpriteBaseDOS).super_SpriteBase.data = puVar6;
  std::shared_ptr<MutableBuffer>::~shared_ptr((shared_ptr<MutableBuffer> *)&color);
  return;
}

Assistant:

DataSourceDOS::SpriteDosSolid::SpriteDosSolid(PBuffer _data, ColorDOS *palette)
  : SpriteBaseDOS(_data) {
  size_t size = _data->get_size();
  if (size != (width * height + 10)) {
    throw ExceptionFreeserf("Failed to extract DOS solid sprite");
  }

  PMutableBuffer result = std::make_shared<MutableBuffer>(Buffer::EndianessBig);

  while (_data->readable()) {
    ColorDOS color = palette[_data->pop<uint8_t>()];
    result->push<uint8_t>(color.b);  // Blue
    result->push<uint8_t>(color.g);  // Green
    result->push<uint8_t>(color.r);  // Red
    result->push<uint8_t>(0xff);     // Alpha
  }

  data = reinterpret_cast<uint8_t*>(result->unfix());
}